

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O3

size_t inform_dist_dump(inform_dist *dist,double *probs,size_t n)

{
  uint64_t uVar1;
  uint32_t *puVar2;
  size_t i;
  size_t sVar3;
  
  if (dist != (inform_dist *)0x0) {
    sVar3 = 0;
    if (((dist->size == n) && (probs != (double *)0x0)) && (dist->size != 0)) {
      puVar2 = dist->histogram;
      uVar1 = dist->counts;
      sVar3 = 0;
      do {
        probs[sVar3] = (double)puVar2[sVar3] /
                       (((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25)
                       + ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
        sVar3 = sVar3 + 1;
      } while (n != sVar3);
      sVar3 = (size_t)(int)n;
    }
    return sVar3;
  }
  return 0;
}

Assistant:

size_t inform_dist_dump(inform_dist const *dist, double *probs, size_t n)
{
    // if the distribution is NULL or the event is outsize of the support
    if (dist == NULL || dist->size == 0)
    {
        return 0;
    }
    if (probs == NULL)
    {
        return 0;
    }
    if (n != dist->size)
    {
        return 0;
    }
    // loop over the events
    for (size_t i = 0; i < inform_dist_size(dist); ++i)
    {
        // store their probabilities in the array
        probs[i] = inform_dist_unsafe_prob(dist,i);
    }
    return (int) n;
}